

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::objectivec::Options::Options(Options *this)

{
  undefined1 in_R9B;
  StringPiece full;
  StringPiece local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  char *local_30;
  char *suppressions;
  char *local_18;
  char *file_path;
  Options *this_local;
  
  file_path = (char *)this;
  std::__cxx11::string::string((string *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->expected_prefixes_suppressions);
  std::__cxx11::string::string((string *)&this->generate_for_named_framework);
  std::__cxx11::string::string((string *)&this->named_framework_to_proto_path_mappings_path);
  std::__cxx11::string::string((string *)&this->runtime_import_prefix);
  local_18 = getenv("GPB_OBJC_EXPECTED_PACKAGE_PREFIXES");
  if (local_18 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)this,local_18);
  }
  local_30 = getenv("GPB_OBJC_EXPECTED_PACKAGE_PREFIXES_SUPPRESSIONS");
  if (local_30 != (char *)0x0) {
    stringpiece_internal::StringPiece::StringPiece(&local_58,local_30);
    full.length_ = (size_type)";";
    full.ptr_ = (char *)local_58.length_;
    Split_abi_cxx11_(&local_48,(protobuf *)local_58.ptr_,full,(char *)0x1,(bool)in_R9B);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->expected_prefixes_suppressions,&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  }
  this->prefixes_must_be_registered = false;
  this->require_prefixes = false;
  return;
}

Assistant:

Options::Options() {
  // Default is the value of the env for the package prefixes.
  const char* file_path = getenv("GPB_OBJC_EXPECTED_PACKAGE_PREFIXES");
  if (file_path) {
    expected_prefixes_path = file_path;
  }
  const char* suppressions = getenv("GPB_OBJC_EXPECTED_PACKAGE_PREFIXES_SUPPRESSIONS");
  if (suppressions) {
    expected_prefixes_suppressions =
        Split(suppressions, ";", true);
  }
  prefixes_must_be_registered = false;
  require_prefixes = false;
}